

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::
PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>::
MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&>::~MonomorphicImpl
          (MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&> *this)

{
  MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&> *this_local;
  
  (this->super_MatcherInterface<const_std::vector<char,_std::allocator<char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MonomorphicImpl_003f0068;
  internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>::~TrulyMatcher(&this->impl_);
  MatcherInterface<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherInterface
            (&this->super_MatcherInterface<const_std::vector<char,_std::allocator<char>_>_&>);
  return;
}

Assistant:

explicit MonomorphicImpl(const Impl& impl) : impl_(impl) {}